

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# hierarchic_fe.h
# Opt level: O0

void __thiscall
lf::fe::FeHierarchicTria<double>::FeHierarchicTria
          (FeHierarchicTria<double> *this,uint interior_degree,array<unsigned_int,_3UL> edge_degrees
          ,QuadRuleCache *qr_cache,
          span<const_lf::mesh::Orientation,_18446744073709551615UL> rel_orient)

{
  RefEl RVar1;
  reference pvVar2;
  QuadRule *pQVar3;
  stringstream ss_3;
  stringstream ss_2;
  stringstream ss_1;
  stringstream ss;
  QuadRuleCache *qr_cache_local;
  uint interior_degree_local;
  FeHierarchicTria<double> *this_local;
  array<unsigned_int,_3UL> edge_degrees_local;
  
  (this->super_ScalarReferenceFiniteElement<double>)._vptr_ScalarReferenceFiniteElement =
       (_func_int **)0x0;
  ScalarReferenceFiniteElement<double>::ScalarReferenceFiniteElement
            (&this->super_ScalarReferenceFiniteElement<double>);
  (this->super_ScalarReferenceFiniteElement<double>)._vptr_ScalarReferenceFiniteElement =
       (_func_int **)&PTR__FeHierarchicTria_00ea9e48;
  this->interior_degree_ = interior_degree;
  (this->edge_degrees_)._M_elems[2] = edge_degrees._M_elems[2];
  *(long *)(this->edge_degrees_)._M_elems = edge_degrees._M_elems._0_8_;
  RVar1 = lf::base::RefEl::kSegment();
  pvVar2 = std::array<unsigned_int,_3UL>::operator[](&this->edge_degrees_,0);
  pQVar3 = quad::QuadRuleCache::Get(qr_cache,RVar1,*pvVar2 * 2 - 2);
  (this->qr_dual_edge_)._M_elems[0] = pQVar3;
  RVar1 = lf::base::RefEl::kSegment();
  pvVar2 = std::array<unsigned_int,_3UL>::operator[](&this->edge_degrees_,1);
  pQVar3 = quad::QuadRuleCache::Get(qr_cache,RVar1,*pvVar2 * 2 - 2);
  (this->qr_dual_edge_)._M_elems[1] = pQVar3;
  RVar1 = lf::base::RefEl::kSegment();
  pvVar2 = std::array<unsigned_int,_3UL>::operator[](&this->edge_degrees_,2);
  pQVar3 = quad::QuadRuleCache::Get(qr_cache,RVar1,*pvVar2 * 2 - 2);
  (this->qr_dual_edge_)._M_elems[2] = pQVar3;
  RVar1 = lf::base::RefEl::kTria();
  pQVar3 = quad::QuadRuleCache::Get(qr_cache,RVar1,this->interior_degree_ * 2 - 2);
  this->qr_dual_tria_ = pQVar3;
  (this->rel_orient_)._M_ptr = rel_orient._M_ptr;
  (this->rel_orient_)._M_extent._M_extent_value = rel_orient._M_extent._M_extent_value;
  std::array<unsigned_int,_3UL>::operator[](&this->edge_degrees_,0);
  std::array<unsigned_int,_3UL>::operator[](&this->edge_degrees_,1);
  std::array<unsigned_int,_3UL>::operator[](&this->edge_degrees_,2);
  return;
}

Assistant:

FeHierarchicTria(unsigned interior_degree,
                   std::array<unsigned, 3> edge_degrees,
                   const quad::QuadRuleCache &qr_cache,
                   std::span<const lf::mesh::Orientation> rel_orient)
      : ScalarReferenceFiniteElement<SCALAR>(),
        interior_degree_(interior_degree),
        edge_degrees_(edge_degrees),
        qr_dual_edge_(
            {&qr_cache.Get(base::RefEl::kSegment(), 2 * (edge_degrees_[0] - 1)),
             &qr_cache.Get(base::RefEl::kSegment(), 2 * (edge_degrees_[1] - 1)),
             &qr_cache.Get(base::RefEl::kSegment(),
                           2 * (edge_degrees_[2] - 1))}),
        qr_dual_tria_(&qr_cache.Get(lf::base::RefEl::kTria(),
                                    2 * (interior_degree_ - 1))),
        rel_orient_(rel_orient) {
    LF_ASSERT_MSG(interior_degree_ >= 0, "illegal interior degree.");
    LF_ASSERT_MSG(edge_degrees_[0] >= 0, "illegal degree for edge 0");
    LF_ASSERT_MSG(edge_degrees_[1] >= 0, "illegal degree for edge 1");
    LF_ASSERT_MSG(edge_degrees_[2] >= 0, "illegal degree for edge 2");
  }